

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.c
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  long lVar2;
  mpt_config *cfg;
  mpt_path p;
  
  cfg = (mpt_config *)0x0;
  p.len = 0;
  p.first = '\0';
  p.flags = '\0';
  p.sep = '.';
  p.assign = '\0';
  p._28_4_ = 0;
  p.base._0_4_ = 0;
  p.base._4_4_ = 0;
  p.off._0_4_ = 0;
  p.off._4_4_ = 0;
  mtrace();
  mpt_path_set(&p,"env",0xffffffffffffffff);
  plVar1 = (long *)mpt_config_global(&p);
  (**(code **)*plVar1)(plVar1,0x85,&cfg);
  for (lVar2 = 1; argc != (int)lVar2; lVar2 = lVar2 + 1) {
    mpt_config_environ(cfg,argv[lVar2],0x5f,0);
  }
  mpt_config_set(cfg,"ls.colors",0,0x2e,0);
  (*cfg->_vptr->query)(cfg,(mpt_path *)0x0,table_print,_stdout);
  (**(code **)(*plVar1 + 8))(plVar1);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	MPT_INTERFACE(metatype) *mt;
	MPT_INTERFACE(config) *cfg = 0;
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	mtrace();
	
	mpt_path_set(&p, "env", -1);
	mt = mpt_config_global(&p);
	MPT_metatype_convert(mt, MPT_ENUM(TypeConfigPtr), &cfg);
	
	for (++argv; --argc; ++argv) {
		mpt_config_environ(cfg, *argv, '_', 0);
	}
	mpt_config_set(cfg, "ls.colors", 0, '.', 0);
	
	cfg->_vptr->query(cfg, 0, table_print, stdout);
	
	mt->_vptr->unref(mt);
	return 0;
}